

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::doAddCols(SPxLPBase<double> *this,LPColSetBase<double> *set,bool scale)

{
  int iVar1;
  int p_size;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  Nonzero<double> *pNVar5;
  Item *pIVar6;
  long lVar7;
  int *piVar8;
  double *pdVar9;
  ulong uVar10;
  Nonzero<double> *pNVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  Item *pIVar15;
  long lVar16;
  double dVar17;
  DataArray<int> newRows;
  LPRowBase<double> empty;
  DataArray<int> local_88;
  DataArray<int> *local_70;
  LPRowBase<double> local_68;
  
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar7 = (long)iVar1;
  p_size = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  DataArray<int>::DataArray(&local_88,p_size,0,1.2);
  if (&this->super_LPColSetBase<double> != set) {
    LPColSetBase<double>::add(&this->super_LPColSetBase<double>,set);
  }
  for (uVar10 = (ulong)(uint)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      0 < (int)uVar10; uVar10 = uVar10 - 1) {
    local_88.data[uVar10 - 1] = 0;
  }
  uVar10 = (ulong)(uint)(set->super_SVSetBase<double>).set.thenum;
  piVar8 = local_88.data;
  while (0 < (int)uVar10) {
    uVar10 = uVar10 - 1;
    pIVar15 = (set->super_SVSetBase<double>).set.theitem;
    iVar12 = (set->super_SVSetBase<double>).set.thekey[uVar10].idx;
    uVar14 = (ulong)(uint)pIVar15[iVar12].data.super_SVectorBase<double>.memused;
    while (0 < (int)uVar14) {
      iVar2 = pIVar15[iVar12].data.super_SVectorBase<double>.m_elem[uVar14 - 1].idx;
      if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
        LPRowBase<double>::LPRowBase(&local_68,0);
        DataArray<int>::reSize(&local_88,iVar2 + 1);
        for (lVar13 = (long)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
            lVar13 <= iVar2; lVar13 = lVar13 + 1) {
          local_88.data[lVar13] = 0;
          LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&local_68);
        }
        DSVectorBase<double>::~DSVectorBase(&local_68.vec);
        piVar8 = local_88.data;
      }
      piVar8[iVar2] = piVar8[iVar2] + 1;
      uVar14 = uVar14 - 1;
    }
  }
  for (lVar13 = 0; lVar13 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar13 = lVar13 + 1) {
    if (0 < local_88.data[lVar13]) {
      iVar12 = local_88.data[lVar13] +
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
               [(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar13].idx].
               data.super_SVectorBase<double>.memused;
      LPRowSetBase<double>::xtend(&this->super_LPRowSetBase<double>,(int)lVar13,iVar12);
      (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
      [(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar13].idx].data.
      super_SVectorBase<double>.memused = iVar12;
    }
  }
  local_70 = &(this->super_LPRowSetBase<double>).scaleExp;
  for (; iVar12 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,
      lVar7 < iVar12; lVar7 = lVar7 + 1) {
    if (this->thesense != MAXIMIZE) {
      pdVar4 = (this->super_LPColSetBase<double>).object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4[lVar7] = -pdVar4[lVar7];
    }
    pIVar15 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
              (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar7].idx;
    iVar12 = 0;
    if (scale) {
      iVar12 = (*this->lp_scaler->_vptr_SPxScaler[1])(this->lp_scaler,pIVar15,local_70);
      dVar17 = (this->super_LPColSetBase<double>).up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar7];
      pdVar9 = (double *)infinity();
      if (dVar17 < *pdVar9) {
        dVar17 = ldexp((this->super_LPColSetBase<double>).up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7],-iVar12);
        (this->super_LPColSetBase<double>).up.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = dVar17;
      }
      dVar17 = (this->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar7];
      pdVar9 = (double *)infinity();
      if (-*pdVar9 < dVar17) {
        dVar17 = ldexp((this->super_LPColSetBase<double>).low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7],-iVar12);
        (this->super_LPColSetBase<double>).low.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = dVar17;
      }
      dVar17 = ldexp((this->super_LPColSetBase<double>).object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7],iVar12);
      (this->super_LPColSetBase<double>).object.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar7] = dVar17;
      (this->super_LPColSetBase<double>).scaleExp.data[lVar7] = iVar12;
    }
    uVar10 = (ulong)(uint)(pIVar15->data).super_SVectorBase<double>.memused;
    lVar13 = uVar10 << 4;
    for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
      pNVar5 = (pIVar15->data).super_SVectorBase<double>.m_elem;
      iVar2 = *(int *)((long)pNVar5 + lVar13 + -8);
      pIVar6 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar3 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx;
      lVar16 = (long)pIVar6[iVar3].data.super_SVectorBase<double>.memused -
               (long)local_88.data[iVar2];
      local_88.data[iVar2] = local_88.data[iVar2] + -1;
      pNVar11 = pIVar6[iVar3].data.super_SVectorBase<double>.m_elem;
      pNVar11[lVar16].idx = (int)lVar7;
      dVar17 = *(double *)((long)&pNVar5[-1].val + lVar13);
      if (scale) {
        dVar17 = ldexp(dVar17,(this->super_LPRowSetBase<double>).scaleExp.data[iVar2] + iVar12);
        *(double *)((long)&(pIVar15->data).super_SVectorBase<double>.m_elem[-1].val + lVar13) =
             dVar17;
        pNVar11 = pIVar6[iVar3].data.super_SVectorBase<double>.m_elem;
      }
      pNVar11[lVar16].val = dVar17;
      lVar13 = lVar13 + -0x10;
    }
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)(iVar12 - iVar1));
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - p_size));
  DataArray<int>::~DataArray(&local_88);
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }